

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

bool __thiscall raft_functional_common::TestSm::apply_snapshot(TestSm *this,snapshot *s)

{
  snapshot *in_RDI;
  ptr<buffer> snp_buf;
  lock_guard<std::mutex> ll;
  mutex_type *in_stack_ffffffffffffffa8;
  buffer *in_stack_ffffffffffffffc8;
  snapshot *this_00;
  
  this_00 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffa8);
  nuraft::snapshot::serialize(this_00);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)in_RDI
            );
  nuraft::snapshot::deserialize(in_stack_ffffffffffffffc8);
  std::shared_ptr<nuraft::snapshot>::operator=
            ((shared_ptr<nuraft::snapshot> *)in_RDI,
             (shared_ptr<nuraft::snapshot> *)in_stack_ffffffffffffffa8);
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x203653);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x20365d);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x203667);
  return true;
}

Assistant:

bool apply_snapshot(snapshot& s) {
        std::lock_guard<std::mutex> ll(lastSnapshotLock);
        // NOTE: We only handle logical snapshot.
        ptr<buffer> snp_buf = s.serialize();
        lastSnapshot = snapshot::deserialize(*snp_buf);
        return true;
    }